

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::DebugPrint(Triangle *this)

{
  ostream *poVar1;
  void *this_00;
  Triangle *this_local;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->points_[0]->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->points_[0]->y);
  std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->points_[1]->x);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->points_[1]->y);
  std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->points_[2]->x);
  poVar1 = std::operator<<(poVar1,",");
  this_00 = (void *)std::ostream::operator<<(poVar1,this->points_[2]->y);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Triangle::DebugPrint()
{
  using namespace std;
  cout << points_[0]->x << "," << points_[0]->y << " ";
  cout << points_[1]->x << "," << points_[1]->y << " ";
  cout << points_[2]->x << "," << points_[2]->y << endl;
}